

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

void __thiscall soplex::SPxDevexPR<double>::setType(SPxDevexPR<double> *this,Type tp)

{
  int in_ESI;
  DIdxSet *in_RDI;
  SPxDevexPR<double> *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffc8;
  int iVar1;
  Array<soplex::SPxPricer<double>::IdxElement> *in_stack_ffffffffffffffd0;
  bool *this_00;
  int newmax;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  setupWeights(unaff_retaddr,(Type)((ulong)in_RDI >> 0x20));
  *(undefined1 *)&in_RDI[5].super_IdxSet.idx = 0;
  IdxSet::clear((IdxSet *)&in_RDI[3].super_IdxSet.idx);
  newmax = (int)((ulong)&in_RDI[3].super_IdxSet.idx >> 0x20);
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2df46f);
  DIdxSet::setMax(in_RDI,newmax);
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2df495);
  Array<soplex::SPxPricer<double>::IdxElement>::reSize(in_stack_ffffffffffffffd0,iVar1);
  if (in_ESI == -1) {
    IdxSet::clear((IdxSet *)&in_RDI[4].super_IdxSet.idx);
    iVar1 = (int)((ulong)&in_RDI[4].super_IdxSet.idx >> 0x20);
    SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2df4d5);
    DIdxSet::setMax(in_RDI,newmax);
    this_00 = &in_RDI[2].super_IdxSet.freeArray;
    SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2df4fa);
    Array<soplex::SPxPricer<double>::IdxElement>::reSize
              ((Array<soplex::SPxPricer<double>::IdxElement> *)this_00,iVar1);
  }
  return;
}

Assistant:

void SPxDevexPR<R>::setType(typename SPxSolverBase<R>::Type tp)
{
   setupWeights(tp);
   refined = false;

   bestPrices.clear();
   bestPrices.setMax(this->thesolver->dim());
   prices.reSize(this->thesolver->dim());

   if(tp == SPxSolverBase<R>::ENTER)
   {
      bestPricesCo.clear();
      bestPricesCo.setMax(this->thesolver->coDim());
      pricesCo.reSize(this->thesolver->coDim());
   }

   assert(isConsistent());
}